

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall
cs_impl::any::holder<cs::type_t>::holder<cs::type_t&>(holder<cs::type_t> *this,type_t *args)

{
  (this->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_0023bd38;
  cs::type_t::type_t(&this->mDat,args);
  return;
}

Assistant:

explicit holder(ArgsT &&...args):mDat(std::forward<ArgsT>(args)...) {}